

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFragmentOpUtil.cpp
# Opt level: O0

void __thiscall
deqp::gls::FragmentOpUtil::QuadRenderer::QuadRenderer
          (QuadRenderer *this,RenderContext *context,GLSLVersion glslVersion)

{
  RenderContext *renderCtx;
  code *pcVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  ShaderProgram *pSVar6;
  TestError *pTVar7;
  bool local_163;
  allocator<char> local_161;
  string local_160;
  allocator<char> local_129;
  string local_128;
  ProgramSources local_108;
  char *local_38;
  char *fragSrc;
  char *vertSrc;
  Functions *gl;
  RenderContext *pRStack_18;
  GLSLVersion glslVersion_local;
  RenderContext *context_local;
  QuadRenderer *this_local;
  
  this->m_context = context;
  this->m_program = (ShaderProgram *)0x0;
  this->m_positionLoc = 0;
  this->m_colorLoc = -1;
  this->m_color1Loc = -1;
  gl._4_4_ = glslVersion;
  pRStack_18 = context;
  context_local = (RenderContext *)this;
  bVar3 = glu::glslVersionIsES(glslVersion);
  local_163 = !bVar3 && 6 < (int)gl._4_4_;
  this->m_blendFuncExt = local_163;
  iVar4 = (*pRStack_18->_vptr_RenderContext[3])();
  vertSrc = (char *)CONCAT44(extraout_var,iVar4);
  fragSrc = getVertSrc(gl._4_4_);
  local_38 = getFragSrc(gl._4_4_);
  pSVar6 = (ShaderProgram *)operator_new(0xd0);
  pcVar2 = fragSrc;
  renderCtx = this->m_context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,pcVar2,&local_129);
  pcVar2 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,pcVar2,&local_161);
  glu::makeVtxFragSources(&local_108,&local_128,&local_160);
  glu::ShaderProgram::ShaderProgram(pSVar6,renderCtx,&local_108);
  this->m_program = pSVar6;
  glu::ProgramSources::~ProgramSources(&local_108);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  bVar3 = glu::ShaderProgram::isOk(this->m_program);
  if (!bVar3) {
    pSVar6 = this->m_program;
    if (pSVar6 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(pSVar6);
      operator_delete(pSVar6,0xd0);
    }
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Failed to compile program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsFragmentOpUtil.cpp"
               ,0x9c);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pcVar1 = *(code **)(vertSrc + 0x780);
  dVar5 = glu::ShaderProgram::getProgram(this->m_program);
  iVar4 = (*pcVar1)(dVar5,"a_position");
  this->m_positionLoc = iVar4;
  pcVar1 = *(code **)(vertSrc + 0x780);
  dVar5 = glu::ShaderProgram::getProgram(this->m_program);
  iVar4 = (*pcVar1)(dVar5,"a_color");
  this->m_colorLoc = iVar4;
  if ((this->m_blendFuncExt & 1U) != 0) {
    pcVar1 = *(code **)(vertSrc + 0x780);
    dVar5 = glu::ShaderProgram::getProgram(this->m_program);
    iVar4 = (*pcVar1)(dVar5,"a_color1");
    this->m_color1Loc = iVar4;
  }
  if (((-1 < this->m_positionLoc) && (-1 < this->m_colorLoc)) &&
     (((this->m_blendFuncExt & 1U) == 0 || (-1 < this->m_color1Loc)))) {
    return;
  }
  pSVar6 = this->m_program;
  if (pSVar6 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(pSVar6);
    operator_delete(pSVar6,0xd0);
  }
  pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar7,"Invalid attribute locations",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsFragmentOpUtil.cpp"
             ,0xa8);
  __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

QuadRenderer::QuadRenderer (const glu::RenderContext& context, glu::GLSLVersion glslVersion)
	: m_context			(context)
	, m_program			(DE_NULL)
	, m_positionLoc		(0)
	, m_colorLoc		(-1)
	, m_color1Loc		(-1)
	, m_blendFuncExt	(!glu::glslVersionIsES(glslVersion) && (glslVersion >= glu::GLSL_VERSION_330))
{
	DE_ASSERT(glslVersion == glu::GLSL_VERSION_100_ES ||
			  glslVersion == glu::GLSL_VERSION_300_ES ||
			  glslVersion == glu::GLSL_VERSION_330);

	const glw::Functions&	gl		= context.getFunctions();
	const char*				vertSrc	= getVertSrc(glslVersion);
	const char*				fragSrc	= getFragSrc(glslVersion);

	m_program = new glu::ShaderProgram(m_context, glu::makeVtxFragSources(vertSrc, fragSrc));
	if (!m_program->isOk())
	{
		delete m_program;
		throw tcu::TestError("Failed to compile program", DE_NULL, __FILE__, __LINE__);
	}

	m_positionLoc	= gl.getAttribLocation(m_program->getProgram(), "a_position");
	m_colorLoc		= gl.getAttribLocation(m_program->getProgram(), "a_color");

	if (m_blendFuncExt)
		m_color1Loc = gl.getAttribLocation(m_program->getProgram(), "a_color1");

	if (m_positionLoc < 0 || m_colorLoc < 0 || (m_blendFuncExt && m_color1Loc < 0))
	{
		delete m_program;
		throw tcu::TestError("Invalid attribute locations", DE_NULL, __FILE__, __LINE__);
	}
}